

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1540::run(TestCase1540 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  bool bVar1;
  undefined1 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc91;
  undefined1 in_stack_fffffffffffffc92;
  undefined1 in_stack_fffffffffffffc93;
  undefined1 in_stack_fffffffffffffc94;
  undefined1 in_stack_fffffffffffffc95;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  bool local_341;
  undefined1 local_340 [7];
  bool _kj_shouldLog_15;
  bool local_30b;
  DebugExpression<bool> local_30a;
  bool local_309;
  undefined1 local_308 [6];
  DebugExpression<bool> _kjCondition_15;
  bool _kj_shouldLog_14;
  bool local_2d3;
  DebugExpression<bool> local_2d2;
  bool local_2d1;
  undefined1 local_2d0 [6];
  DebugExpression<bool> _kjCondition_14;
  bool _kj_shouldLog_13;
  bool local_29b;
  DebugExpression<bool> local_29a;
  bool local_299;
  undefined1 local_298 [6];
  DebugExpression<bool> _kjCondition_13;
  bool _kj_shouldLog_12;
  bool local_266;
  DebugExpression<bool> local_265;
  bool local_264;
  bool local_263;
  DebugExpression<bool> local_262;
  bool local_261;
  bool local_260;
  DebugExpression<bool> local_25f;
  bool local_25e;
  DebugExpression<bool> _kjCondition_12;
  bool _kj_shouldLog_11;
  bool local_25b;
  DebugExpression<bool> _kjCondition_11;
  bool _kj_shouldLog_10;
  DebugExpression<bool> _kjCondition_10;
  bool _kj_shouldLog_9;
  DebugExpression<bool> _kjCondition_9;
  bool _kj_shouldLog_8;
  SegmentBuilder *pSStack_258;
  DebugExpression<bool> _kjCondition_8;
  bool local_221;
  undefined1 local_220 [7];
  bool _kj_shouldLog_7;
  bool local_1eb;
  DebugExpression<bool> local_1ea;
  bool local_1e9;
  undefined1 local_1e8 [6];
  DebugExpression<bool> _kjCondition_7;
  bool _kj_shouldLog_6;
  bool local_1b3;
  DebugExpression<bool> local_1b2;
  bool local_1b1;
  undefined1 local_1b0 [6];
  DebugExpression<bool> _kjCondition_6;
  bool _kj_shouldLog_5;
  bool local_17b;
  DebugExpression<bool> local_17a;
  bool local_179;
  undefined1 local_178 [6];
  DebugExpression<bool> _kjCondition_5;
  bool _kj_shouldLog_4;
  bool local_142;
  DebugExpression<bool> local_141;
  bool local_140;
  bool local_13f;
  DebugExpression<bool> local_13e;
  bool local_13d;
  bool local_13c;
  DebugExpression<bool> local_13b;
  bool local_13a;
  DebugExpression<bool> _kjCondition_4;
  bool _kj_shouldLog_3;
  bool local_137;
  DebugExpression<bool> _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<bool> _kjCondition_2;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1540 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)auStack_128);
  _kjCondition_3.value = (bool)(~bVar1 & 1);
  _kj_shouldLog_2 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_3.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_2);
  if (!bVar1) {
    local_137 = kj::_::Debug::shouldLog(ERROR);
    while (local_137 != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x609,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
                 (char (*) [40])"failed: expected !(root.hasTextField())",
                 (DebugExpression<bool> *)&_kj_shouldLog_2);
      local_137 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField((Builder *)auStack_128);
  _kjCondition_4.value = (bool)(~bVar1 & 1);
  _kj_shouldLog_3 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_4.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_3);
  if (!bVar1) {
    local_13a = kj::_::Debug::shouldLog(ERROR);
    while (local_13a != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x60a,ERROR,"\"failed: expected \" \"!(root.hasDataField())\", _kjCondition",
                 (char (*) [40])"failed: expected !(root.hasDataField())",
                 (DebugExpression<bool> *)&_kj_shouldLog_3);
      local_13a = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)auStack_128)
  ;
  local_13c = (bool)(~bVar1 & 1);
  local_13b = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_13c);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_13b);
  if (!bVar1) {
    local_13d = kj::_::Debug::shouldLog(ERROR);
    while (local_13d != false) {
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x60b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\", _kjCondition",
                 (char (*) [42])"failed: expected !(root.hasStructField())",&local_13b);
      local_13d = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)auStack_128);
  local_13f = (bool)(~bVar1 & 1);
  local_13e = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_13f);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_13e);
  if (!bVar1) {
    local_140 = kj::_::Debug::shouldLog(ERROR);
    while (local_140 != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x60c,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\", _kjCondition",
                 (char (*) [40])"failed: expected !(root.hasInt32List())",&local_13e);
      local_140 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_178,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)local_178);
  local_142 = (bool)(~bVar1 & 1);
  local_141 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_142);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_141);
  if (!bVar1) {
    local_179 = kj::_::Debug::shouldLog(ERROR);
    while (local_179 != false) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x60e,ERROR,
                 "\"failed: expected \" \"!(root.asReader().hasTextField())\", _kjCondition",
                 (char (*) [51])"failed: expected !(root.asReader().hasTextField())",&local_141);
      local_179 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_1b0,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)local_1b0);
  local_17b = (bool)(~bVar1 & 1);
  local_17a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_17b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_17a);
  if (!bVar1) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x60f,ERROR,
                 "\"failed: expected \" \"!(root.asReader().hasDataField())\", _kjCondition",
                 (char (*) [51])"failed: expected !(root.asReader().hasDataField())",&local_17a);
      local_1b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_1e8,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)local_1e8);
  local_1b3 = (bool)(~bVar1 & 1);
  local_1b2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b3);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1b2);
  if (!bVar1) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      kj::_::Debug::log<char_const(&)[53],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x610,ERROR,
                 "\"failed: expected \" \"!(root.asReader().hasStructField())\", _kjCondition",
                 (char (*) [53])"failed: expected !(root.asReader().hasStructField())",&local_1b2);
      local_1e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_220,(Builder *)auStack_128);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)local_220);
  local_1eb = (bool)(~bVar1 & 1);
  local_1ea = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1eb);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1ea);
  if (!bVar1) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x611,ERROR,
                 "\"failed: expected \" \"!(root.asReader().hasInt32List())\", _kjCondition",
                 (char (*) [51])"failed: expected !(root.asReader().hasInt32List())",&local_1ea);
      local_221 = false;
    }
  }
  pSStack_258 = (SegmentBuilder *)auStack_128;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize._0_1_ = in_stack_fffffffffffffc90;
  builder_00._builder.dataSize._1_1_ = in_stack_fffffffffffffc91;
  builder_00._builder.dataSize._2_1_ = in_stack_fffffffffffffc92;
  builder_00._builder.dataSize._3_1_ = in_stack_fffffffffffffc93;
  builder_00._builder.pointerCount._0_1_ = in_stack_fffffffffffffc94;
  builder_00._builder.pointerCount._1_1_ = in_stack_fffffffffffffc95;
  builder_00._builder._38_1_ = in_stack_fffffffffffffc96;
  builder_00._builder._39_1_ = in_stack_fffffffffffffc97;
  initTestMessage(builder_00);
  _kjCondition_11.value =
       capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)auStack_128);
  _kj_shouldLog_10 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_11.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_10);
  if (!bVar1) {
    local_25b = kj::_::Debug::shouldLog(ERROR);
    while (local_25b != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x615,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
                 (char (*) [37])"failed: expected root.hasTextField()",
                 (DebugExpression<bool> *)&_kj_shouldLog_10);
      local_25b = false;
    }
  }
  _kjCondition_12.value =
       capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField((Builder *)auStack_128);
  _kj_shouldLog_11 =
       (bool)kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_12.value);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kj_shouldLog_11);
  if (!bVar1) {
    local_25e = kj::_::Debug::shouldLog(ERROR);
    while (local_25e != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x616,ERROR,"\"failed: expected \" \"root.hasDataField()\", _kjCondition",
                 (char (*) [37])"failed: expected root.hasDataField()",
                 (DebugExpression<bool> *)&_kj_shouldLog_11);
      local_25e = false;
    }
  }
  local_260 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField
                        ((Builder *)auStack_128);
  local_25f = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_260);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_25f);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x617,ERROR,"\"failed: expected \" \"root.hasStructField()\", _kjCondition",
                 (char (*) [39])"failed: expected root.hasStructField()",&local_25f);
      local_261 = false;
    }
  }
  local_263 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List
                        ((Builder *)auStack_128);
  local_262 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_263);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_262);
  if (!bVar1) {
    local_264 = kj::_::Debug::shouldLog(ERROR);
    while (local_264 != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x618,ERROR,"\"failed: expected \" \"root.hasInt32List()\", _kjCondition",
                 (char (*) [37])"failed: expected root.hasInt32List()",&local_262);
      local_264 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_298,(Builder *)auStack_128);
  local_266 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)local_298);
  local_265 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_266);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_265);
  if (!bVar1) {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (local_299 != false) {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x61a,ERROR,
                 "\"failed: expected \" \"root.asReader().hasTextField()\", _kjCondition",
                 (char (*) [48])"failed: expected root.asReader().hasTextField()",&local_265);
      local_299 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_2d0,(Builder *)auStack_128);
  local_29b = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)local_2d0);
  local_29a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_29b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_29a);
  if (!bVar1) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x61b,ERROR,
                 "\"failed: expected \" \"root.asReader().hasDataField()\", _kjCondition",
                 (char (*) [48])"failed: expected root.asReader().hasDataField()",&local_29a);
      local_2d1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_308,(Builder *)auStack_128);
  local_2d3 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)local_308)
  ;
  local_2d2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d3);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2d2);
  if (!bVar1) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x61c,ERROR,
                 "\"failed: expected \" \"root.asReader().hasStructField()\", _kjCondition",
                 (char (*) [50])"failed: expected root.asReader().hasStructField()",&local_2d2);
      local_309 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_340,(Builder *)auStack_128);
  local_30b = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)local_340);
  local_30a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_30b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_30a);
  if (!bVar1) {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x61d,ERROR,
                 "\"failed: expected \" \"root.asReader().hasInt32List()\", _kjCondition",
                 (char (*) [48])"failed: expected root.asReader().hasInt32List()",&local_30a);
      local_341 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}